

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
grow(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *this,
    Entry *oldEntries,size_t *newMemUsed)

{
  pointer *pppEVar1;
  iterator __position;
  uint uVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  Entry *local_28;
  
  __position._M_current =
       (this->_oldEntries).
       super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = oldEntries;
  if (__position._M_current ==
      (this->_oldEntries).
      super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*>>
    ::
    _M_realloc_insert<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*const&>
              ((vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*>>
                *)&this->_oldEntries,__position,&local_28);
  }
  else {
    *__position._M_current = oldEntries;
    pppEVar1 = &(this->_oldEntries).
                super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  uVar2 = this->_numEntries * 2;
  uVar7 = (ulong)uVar2 * 0x10;
  pEVar3 = (Entry *)operator_new__(uVar7);
  if (uVar2 != 0) {
    pEVar4 = pEVar3;
    do {
      (pEVar4->key)._val = -1;
      pEVar4->value = (FaceData *)0x0;
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar3 + uVar2);
  }
  *newMemUsed = uVar7;
  if (this->_numEntries != 0) {
    uVar7 = 0;
    do {
      if (local_28[uVar7].value != (FaceData *)0x0) {
        pEVar4 = local_28 + uVar7;
        uVar6 = (pEVar4->key)._val;
        do {
          uVar5 = (uint)uVar6 & uVar2 - 1;
          uVar6 = (ulong)((uint)uVar6 + 1);
        } while (pEVar3[uVar5].value != (FaceData *)0x0);
        pEVar3[uVar5].key._val = (pEVar4->key)._val;
        pEVar3[uVar5].value = pEVar4->value;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->_numEntries);
  }
  this->_numEntries = uVar2;
  return pEVar3;
}

Assistant:

Entry* grow(Entry* oldEntries, size_t& newMemUsed)
    {
        _oldEntries.push_back(oldEntries);
        uint32_t numNewEntries = _numEntries*2;
        Entry* entries = new Entry[numNewEntries];
        newMemUsed = numNewEntries * sizeof(Entry);
        uint32_t mask = numNewEntries-1;
        for (uint32_t oldIndex = 0; oldIndex < _numEntries; ++oldIndex) {
            Entry& oldEntry = oldEntries[oldIndex];
            if (oldEntry.value) {
                for (int newIndex = oldEntry.key.hash();; ++newIndex) {
                    Entry& newEntry = entries[newIndex&mask];
                    if (!newEntry.value) {
                        newEntry.key.move(oldEntry.key);
                        newEntry.value = oldEntry.value;
                        break;
                    }
                }
            }
        }
        _numEntries = numNewEntries;
        return entries;
    }